

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

int is_8x8_block_skip(MB_MODE_INFO **grid,int mi_row,int mi_col,int mi_stride)

{
  int c;
  int r;
  MB_MODE_INFO **mbmi;
  int mi_stride_local;
  int mi_col_local;
  int mi_row_local;
  MB_MODE_INFO **grid_local;
  
  mbmi = grid + (long)(mi_row * mi_stride) + (long)mi_col;
  r = 0;
  do {
    if (1 < r) {
      return 1;
    }
    for (c = 0; c < 2; c = c + 1) {
      if (mbmi[c]->skip_txfm == '\0') {
        return 0;
      }
    }
    r = r + 1;
    mbmi = mbmi + mi_stride;
  } while( true );
}

Assistant:

static int is_8x8_block_skip(MB_MODE_INFO **grid, int mi_row, int mi_col,
                             int mi_stride) {
  MB_MODE_INFO **mbmi = grid + mi_row * mi_stride + mi_col;
  for (int r = 0; r < mi_size_high[BLOCK_8X8]; ++r, mbmi += mi_stride) {
    for (int c = 0; c < mi_size_wide[BLOCK_8X8]; ++c) {
      if (!mbmi[c]->skip_txfm) return 0;
    }
  }

  return 1;
}